

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionProxy::FunctionProxy
          (FunctionProxy *this,ScriptContext *scriptContext,Utf8SourceInfo *utf8SourceInfo,
          uint functionNumber)

{
  nullptr_t local_40;
  nullptr_t local_38;
  nullptr_t local_30;
  uint local_24;
  Utf8SourceInfo *pUStack_20;
  uint functionNumber_local;
  Utf8SourceInfo *utf8SourceInfo_local;
  ScriptContext *scriptContext_local;
  FunctionProxy *this_local;
  
  local_24 = functionNumber;
  pUStack_20 = utf8SourceInfo;
  utf8SourceInfo_local = (Utf8SourceInfo *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  FinalizableObject::FinalizableObject(&this->super_FinalizableObject);
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01de04c8;
  Memory::WriteBarrierPtr<Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>_>::
  WriteBarrierPtr(&this->auxPtrs);
  Memory::WriteBarrierPtr<Js::FunctionInfo>::WriteBarrierPtr(&this->functionInfo);
  this->m_scriptContext = (Type)utf8SourceInfo_local;
  Memory::WriteBarrierPtr<Js::Utf8SourceInfo>::WriteBarrierPtr(&this->m_utf8SourceInfo,pUStack_20);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::ScriptFunctionType>::WriteBarrierPtr
            (&this->deferredPrototypeType,&local_30);
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::ScriptFunctionType>::WriteBarrierPtr
            (&this->undeferredFunctionType,&local_38);
  local_40 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::ProxyEntryPointInfo>::WriteBarrierPtr
            (&this->m_defaultEntryPointInfo,&local_40);
  this->m_functionNumber = local_24;
  this->field_0x44 = this->field_0x44 & 0xfe | 1;
  this->field_0x44 = this->field_0x44 & 0xfd;
  this->field_0x44 = this->field_0x44 & 0xfb;
  this->field_0x44 = this->field_0x44 & 0xf7;
  this->field_0x44 = this->field_0x44 & 0xdf;
  return;
}

Assistant:

FunctionProxy::FunctionProxy(ScriptContext* scriptContext, Utf8SourceInfo* utf8SourceInfo, uint functionNumber):
        m_isTopLevel(false),
        m_isPublicLibraryCode(false),
        m_scriptContext(scriptContext),
        deferredPrototypeType(nullptr),
        undeferredFunctionType(nullptr),
        m_utf8SourceInfo(utf8SourceInfo),
        m_functionNumber(functionNumber),
        m_defaultEntryPointInfo(nullptr),
        m_displayNameIsRecyclerAllocated(false),
        m_tag11(true),
        m_isJsBuiltInCode(false)
    {
        PERF_COUNTER_INC(Code, TotalFunction);
    }